

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O3

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::
~Persistent_cohomology
          (Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
           *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pointer ptVar3;
  pointer ppPVar4;
  pointer puVar5;
  pointer piVar6;
  node_ptr to_erase;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  node_ptr to_erase_1;
  
  p_Var8 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var8 == &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header) {
      boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                (&(this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>);
      boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                (&(this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>);
      ptVar3 = (this->persistent_pairs_).
               super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ptVar3 != (pointer)0x0) {
        operator_delete(ptVar3,(long)(this->persistent_pairs_).
                                     super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ptVar3);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>,_std::_Select1st<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
      ::~_Rb_tree(&(this->transverse_idx_)._M_t);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&(this->zero_cocycles_)._M_h);
      ppPVar4 = (this->ds_repr_).
                super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppPVar4 != (pointer)0x0) {
        operator_delete(ppPVar4,(long)(this->ds_repr_).
                                      super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,_int>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppPVar4);
      }
      puVar5 = (this->ds_parent_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5,(long)(this->ds_parent_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar5);
      }
      piVar6 = (this->ds_rank_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar6 != (pointer)0x0) {
        operator_delete(piVar6,(long)(this->ds_rank_).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)piVar6);
      }
      piVar6 = (this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar6 == (pointer)0x0) {
        return;
      }
      operator_delete(piVar6,(long)(this->coeff_field_).inverse_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar6);
      return;
    }
    p_Var1 = p_Var8[1]._M_parent;
    p_Var7 = *(_Base_ptr *)p_Var1;
    if (*(_Base_ptr *)p_Var1 == p_Var1) {
      p_Var1->_M_parent = p_Var1;
      p_Var7 = p_Var1;
LAB_0010e5eb:
      *(undefined8 *)p_Var7 = 0;
      p_Var7->_M_parent = (_Base_ptr)0x0;
    }
    else {
      do {
        p_Var2 = *(_Base_ptr *)p_Var7;
        *(undefined8 *)p_Var7 = 0;
        p_Var7->_M_parent = (_Base_ptr)0x0;
        p_Var7 = p_Var2;
      } while (p_Var2 != p_Var1);
      p_Var7 = p_Var8[1]._M_parent;
      *(_Base_ptr *)p_Var1 = p_Var1;
      p_Var1->_M_parent = p_Var1;
      if (p_Var7 != (_Base_ptr)0x0) {
        p_Var1 = *(_Base_ptr *)p_Var7;
        while (p_Var1 != p_Var7) {
          p_Var2 = *(_Base_ptr *)p_Var1;
          *(undefined8 *)p_Var1 = 0;
          p_Var1->_M_parent = (_Base_ptr)0x0;
          p_Var1 = p_Var2;
        }
        goto LAB_0010e5eb;
      }
      p_Var7 = (_Base_ptr)0x0;
    }
    operator_delete(p_Var7,0x10);
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

~Persistent_cohomology() {
    // Clean the transversal lists
    for (auto & transverse_ref : transverse_idx_) {
      // Destruct all the cells
      transverse_ref.second.row_->clear_and_dispose([&](Cell*p){p->~Cell();});
      delete transverse_ref.second.row_;
    }
  }